

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<float>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<float> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  float p2y;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var1;
  pointer ppVar2;
  bool bVar3;
  type pfVar4;
  reference pvVar5;
  iterator iVar6;
  difference_type dVar7;
  pointer ppVar8;
  iterator iVar9;
  difference_type value_00;
  pointer __first;
  pointer pfVar10;
  float *pfVar11;
  float fVar12;
  int local_130;
  int i_2;
  float div;
  int i_1;
  float value;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_c8;
  pair<float,_int> *local_c0;
  pair<float,_int> *local_b8;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_b0;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_a8;
  pair<float,_int> *local_a0;
  pair<float,_int> *local_98;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_90;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  local_88;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  next;
  iterator end;
  iterator begin;
  pair<float,_int> local_58;
  int local_50 [2];
  int i;
  allocator<std::pair<float,_int>_> local_39;
  undefined1 local_38 [8];
  vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> r;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng_local;
  int n_local;
  default_cost_type<float> *this_local;
  
  r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)rng;
  std::allocator<std::pair<float,_int>_>::allocator(&local_39);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38,
             (long)n,&local_39);
  std::allocator<std::pair<float,_int>_>::~allocator(&local_39);
  for (local_50[0] = 0; local_50[0] != n; local_50[0] = local_50[0] + 1) {
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)local_50[0]);
    std::pair<float,_int>::pair<float_&,_int_&,_true>(&local_58,pfVar4,local_50);
    pvVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::operator[]
                       ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                        local_38,(long)local_50[0]);
    std::pair<float,_int>::operator=(pvVar5,&local_58);
  }
  iVar6 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                    ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                     local_38);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar6._M_current);
  end = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                  ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                   local_38);
  next._M_current =
       (pair<float,_int> *)
       std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                 ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38
                 );
  local_90._M_current =
       (pair<float,_int> *)
       std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                 ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38
                 );
  local_88 = __gnu_cxx::
             __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
             ::operator++(&local_90,0);
  while (bVar3 = __gnu_cxx::
                 operator==<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                           (&local_88,&next), ((bVar3 ^ 0xffU) & 1) != 0) {
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
             ::operator->(&local_88);
    fVar12 = ppVar8->first;
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
             ::operator->(&end);
    if ((fVar12 != ppVar8->first) || (NAN(fVar12) || NAN(ppVar8->first))) {
      local_98 = end._M_current;
      local_a0 = local_88._M_current;
      dVar7 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                        ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          )end._M_current,local_88);
      ppVar2 = r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (1 < dVar7) {
        local_a8._M_current = end._M_current;
        local_b0._M_current = local_88._M_current;
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                 ::operator->(&end);
        fVar12 = ppVar8->first;
        ppVar8 = __gnu_cxx::
                 __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                 ::operator->(&local_88);
        random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                  (local_a8,local_b0,(random_engine *)ppVar2,fVar12,ppVar8->first);
      }
      end._M_current = local_88._M_current;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
    ::operator++(&local_88);
  }
  local_b8 = end._M_current;
  local_c0 = next._M_current;
  dVar7 = std::
          distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                    ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                      )end._M_current,next);
  if (1 < dVar7) {
    local_c8._M_current =
         (pair<float,_int> *)
         std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                   ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    local_38);
    bVar3 = __gnu_cxx::
            operator==<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                      (&end,&local_c8);
    ppVar2 = r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar6 = end;
    _Var1 = next;
    if (bVar3) {
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
               ::operator->(&end);
      fVar12 = ppVar8->first;
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
               ::operator->(&end);
      random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )iVar6._M_current,_Var1,(random_engine *)ppVar2,fVar12,ppVar8->first + 1.0);
    }
    else {
      pvVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::front
                         ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                          local_38);
      fVar12 = pvVar5->first;
      iVar6 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         local_38);
      dVar7 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                        ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          )iVar6._M_current,
                         (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                          )end._M_current);
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
               ::operator->(&end);
      p2y = ppVar8->first;
      iVar6 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         local_38);
      iVar9 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                        ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                         local_38);
      value_00 = std::
                 distance<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                           ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             )iVar6._M_current,
                            (__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                             )iVar9._M_current);
      fVar12 = linearize<long,float>(0,fVar12,dVar7,p2y,value_00);
      ppVar2 = r.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar6 = end;
      _Var1 = next;
      ppVar8 = __gnu_cxx::
               __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
               ::operator->(&end);
      random_epsilon_unique<float,__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )iVar6._M_current,_Var1,(random_engine *)ppVar2,ppVar8->first,fVar12);
    }
  }
  iVar6 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::begin
                    ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                     local_38);
  iVar9 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::end
                    ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                     local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,baryonyx::itm::default_cost_type<float>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar6._M_current,iVar9._M_current);
  for (i_2 = 0; i_2 != n; i_2 = i_2 + 1) {
    pvVar5 = std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::operator[]
                       ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                        local_38,(long)i_2);
    fVar12 = pvVar5->first;
    pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)i_2);
    *pfVar4 = fVar12;
  }
  __first = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->linear_elements);
  pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->linear_elements);
  pfVar11 = std::max_element<float*>(__first,pfVar10 + n);
  fVar12 = *pfVar11;
  bVar3 = std::isnormal(fVar12);
  if (bVar3) {
    for (local_130 = 0; local_130 != n; local_130 = local_130 + 1) {
      pfVar4 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->linear_elements,(long)local_130);
      *pfVar4 = *pfVar4 / fVar12;
    }
  }
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)local_38);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }